

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void google::protobuf::internal::SwapFieldHelper::SwapArenaStringPtr
               (ArenaStringPtr *lhs,Arena *lhs_arena,ArenaStringPtr *rhs,Arena *rhs_arena)

{
  void *pvVar1;
  void *pvVar2;
  pointer pcVar3;
  undefined8 *puVar4;
  string *value;
  string temp;
  string local_48;
  
  if (lhs_arena == rhs_arena) {
    puVar4 = (undefined8 *)(rhs->tagged_ptr_).ptr_;
    (rhs->tagged_ptr_).ptr_ = (lhs->tagged_ptr_).ptr_;
  }
  else {
    pvVar1 = (lhs->tagged_ptr_).ptr_;
    pvVar2 = (rhs->tagged_ptr_).ptr_;
    if (((ulong)pvVar1 & 3) == 0) {
      if (((ulong)pvVar2 & 3) == 0) {
        return;
      }
      ArenaStringPtr::Set<>(lhs,(string *)((ulong)pvVar2 & 0xfffffffffffffffc),lhs_arena);
      ArenaStringPtr::Destroy(rhs);
      (rhs->tagged_ptr_).ptr_ = &fixed_address_empty_string_abi_cxx11_;
      return;
    }
    value = (string *)((ulong)pvVar1 & 0xfffffffffffffffc);
    if (((ulong)pvVar2 & 3) != 0) {
      pcVar3 = (value->_M_dataplus)._M_p;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar3,pcVar3 + value->_M_string_length);
      ArenaStringPtr::Set<>
                (lhs,(string *)((ulong)(rhs->tagged_ptr_).ptr_ & 0xfffffffffffffffc),lhs_arena);
      ArenaStringPtr::Set(rhs,&local_48,rhs_arena);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return;
      }
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      return;
    }
    ArenaStringPtr::Set<>(rhs,value,rhs_arena);
    ArenaStringPtr::Destroy(lhs);
    puVar4 = &fixed_address_empty_string_abi_cxx11_;
  }
  (lhs->tagged_ptr_).ptr_ = puVar4;
  return;
}

Assistant:

void SwapFieldHelper::SwapArenaStringPtr(ArenaStringPtr* lhs, Arena* lhs_arena,
                                         ArenaStringPtr* rhs,
                                         Arena* rhs_arena) {
  if (lhs_arena == rhs_arena) {
    ArenaStringPtr::InternalSwap(lhs, rhs, lhs_arena);
  } else if (lhs->IsDefault() && rhs->IsDefault()) {
    // Nothing to do.
  } else if (lhs->IsDefault()) {
    lhs->Set(rhs->Get(), lhs_arena);
    // rhs needs to be destroyed before overwritten.
    rhs->Destroy();
    rhs->InitDefault();
  } else if (rhs->IsDefault()) {
    rhs->Set(lhs->Get(), rhs_arena);
    // lhs needs to be destroyed before overwritten.
    lhs->Destroy();
    lhs->InitDefault();
  } else {
    std::string temp = lhs->Get();
    lhs->Set(rhs->Get(), lhs_arena);
    rhs->Set(std::move(temp), rhs_arena);
  }
}